

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

void __thiscall
slang::ast::CallExpression::serializeTo(CallExpression *this,ASTSerializer *serializer)

{
  string_view value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  bool bVar1;
  char *pcVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  SystemSubroutine *pSVar4;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar5;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar6;
  reference pbVar7;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar8;
  Expression *pEVar9;
  int in_EDX;
  int __c;
  int __c_00;
  ASTSerializer *in_RSI;
  CallExpression *in_RDI;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  SubroutineSymbol *symbol;
  basic_string_view<char,_std::char_traits<char>_> name;
  iterator __end6;
  iterator __begin6;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range6;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *randInfo;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *itInfo;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *callInfo;
  Expression *in_stack_fffffffffffffe88;
  ASTSerializer *in_stack_fffffffffffffe90;
  ASTSerializer *in_stack_fffffffffffffe98;
  ASTSerializer *in_stack_fffffffffffffea0;
  ASTSerializer *in_stack_fffffffffffffea8;
  ASTSerializer *in_stack_fffffffffffffeb0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_118;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_110;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_100;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_e8;
  int local_d8;
  void *local_d0;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_90;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_88;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *local_80;
  Symbol *in_stack_ffffffffffffff88;
  ASTSerializer *in_stack_ffffffffffffff90;
  int __fd;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  char *local_28;
  void *local_20;
  
  pcVar2 = std::
           variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
           ::index(&in_RDI->subroutine,(char *)in_RSI,in_EDX);
  if (pcVar2 == (char *)0x1) {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         *)0x9d8a45);
    __fd = (int)in_stack_ffffffffffffff98;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_stack_fffffffffffffe98);
    pSVar4 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                       ((not_null<const_slang::ast::SystemSubroutine_*> *)0x9d8a7b);
    ASTSerializer::write(in_RSI,(int)local_28,local_20,(size_t)&pSVar4->name);
    pcVar2 = std::
             variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             ::index(&pvVar3->extraInfo,local_28,__c);
    if (pcVar2 == (char *)0x1) {
      pvVar5 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                           *)0x9d8ac8);
      if (pvVar5->iterVar != (ValueSymbol *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
                   (char *)in_stack_fffffffffffffe98);
        ASTSerializer::write(in_RSI,local_40,local_38,(size_t)pvVar5->iterVar);
      }
      if (pvVar5->iterExpr != (Expression *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
                   (char *)in_stack_fffffffffffffe98);
        ASTSerializer::write(in_RSI,local_50,local_48,(size_t)pvVar5->iterExpr);
      }
    }
    else {
      pcVar2 = std::
               variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               ::index(&pvVar3->extraInfo,local_28,__c_00);
      if (pcVar2 == (char *)0x2) {
        pvVar6 = std::
                 get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                             *)0x9d8bab);
        if (pvVar6->inlineConstraints != (Constraint *)0x0) {
          in_stack_fffffffffffffeb0 = in_RSI;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
                     (char *)in_stack_fffffffffffffe98);
          ASTSerializer::write
                    (in_stack_fffffffffffffeb0,__fd,in_stack_ffffffffffffffa0,
                     (size_t)pvVar6->inlineConstraints);
        }
        bVar1 = std::
                span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                ::empty((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                         *)0x9d8c18);
        if (!bVar1) {
          in_stack_fffffffffffffea8 = in_RSI;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
                     (char *)in_stack_fffffffffffffe98);
          name_00._M_str = (char *)in_stack_fffffffffffffeb0;
          name_00._M_len = (size_t)in_stack_fffffffffffffea8;
          ASTSerializer::startArray(in_stack_fffffffffffffea0,name_00);
          local_80 = &pvVar6->constraintRestrictions;
          local_88._M_current =
               (basic_string_view<char,_std::char_traits<char>_> *)
               std::
               span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
               ::begin((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                        *)in_stack_fffffffffffffe88);
          local_90 = (basic_string_view<char,_std::char_traits<char>_> *)
                     std::
                     span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                     ::end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                            *)in_stack_fffffffffffffe98);
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                              ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffffe90,
                               (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffffe88);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                     ::operator*(&local_88);
            local_b0 = pbVar7->_M_len;
            local_a8 = pbVar7->_M_str;
            value._M_str = (char *)in_stack_fffffffffffffea0;
            value._M_len = (size_t)in_stack_fffffffffffffe98;
            local_a0 = local_b0;
            local_98 = local_a8;
            ASTSerializer::serialize(in_stack_fffffffffffffe90,value);
            __gnu_cxx::
            __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
            ::operator++(&local_88);
          }
          ASTSerializer::endArray((ASTSerializer *)0x9d8d36);
        }
      }
    }
  }
  else {
    ppSVar8 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          *)0x9d8d4a);
    local_b8 = *ppSVar8;
    in_stack_fffffffffffffea0 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_fffffffffffffe98);
    name_02._M_str = in_stack_ffffffffffffffa0;
    name_02._M_len = in_stack_ffffffffffffff98;
    ASTSerializer::writeLink(in_stack_ffffffffffffff90,name_02,in_stack_ffffffffffffff88);
  }
  pEVar9 = thisClass(in_RDI);
  if (pEVar9 != (Expression *)0x0) {
    in_stack_fffffffffffffe98 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_RSI);
    pEVar9 = thisClass(in_RDI);
    ASTSerializer::write(in_stack_fffffffffffffe98,local_d8,local_d0,(size_t)pEVar9);
  }
  local_e8 = arguments((CallExpression *)0x9d8dfa);
  bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9d8e17);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0,
               (char *)in_stack_fffffffffffffe98);
    name_01._M_str = (char *)in_stack_fffffffffffffeb0;
    name_01._M_len = (size_t)in_stack_fffffffffffffea8;
    ASTSerializer::startArray(in_stack_fffffffffffffea0,name_01);
    local_110 = arguments((CallExpression *)0x9d8e67);
    local_100 = &local_110;
    local_118._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffe88);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_RSI,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe88), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*(&local_118);
      ASTSerializer::serialize(in_RSI,in_stack_fffffffffffffe88);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_118);
    }
    ASTSerializer::endArray((ASTSerializer *)0x9d8eed);
  }
  return;
}

Assistant:

void CallExpression::serializeTo(ASTSerializer& serializer) const {
    if (subroutine.index() == 1) {
        auto& callInfo = std::get<1>(subroutine);
        serializer.write("subroutine", callInfo.subroutine->name);

        if (callInfo.extraInfo.index() == 1) {
            auto& itInfo = std::get<1>(callInfo.extraInfo);
            if (itInfo.iterVar)
                serializer.write("iterVar", *itInfo.iterVar);
            if (itInfo.iterExpr)
                serializer.write("iterExpr", *itInfo.iterExpr);
        }
        else if (callInfo.extraInfo.index() == 2) {
            auto& randInfo = std::get<2>(callInfo.extraInfo);
            if (randInfo.inlineConstraints)
                serializer.write("inlineConstraints", *randInfo.inlineConstraints);

            if (!randInfo.constraintRestrictions.empty()) {
                serializer.startArray("constraintRestrictions");
                for (auto name : randInfo.constraintRestrictions)
                    serializer.serialize(name);
                serializer.endArray();
            }
        }
    }
    else {
        const SubroutineSymbol& symbol = *std::get<0>(subroutine);
        serializer.writeLink("subroutine", symbol);
    }

    if (thisClass())
        serializer.write("thisClass", *thisClass());

    if (!arguments().empty()) {
        serializer.startArray("arguments");
        for (auto arg : arguments())
            serializer.serialize(*arg);
        serializer.endArray();
    }
}